

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3b3db::JSONParser::handleToken(JSONParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  runtime_error *prVar4;
  reference pvVar5;
  logic_error *plVar6;
  size_type sVar7;
  JSON *local_610;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 local_589;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_521;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  undefined1 local_4b9;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  parser_state_e local_454;
  JSON local_450;
  JSON local_440;
  undefined1 local_429;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c1;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  JSON local_360;
  undefined1 local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  JSON local_2c8;
  JSON local_2b8;
  JSON local_2a8;
  JSON local_298;
  undefined1 local_281;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_219;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b1;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined4 local_150;
  undefined1 local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  JSON local_e8;
  JSON local_d8;
  lex_state_e local_c4;
  undefined1 local_c0 [4];
  lex_state_e ls;
  JSON tos;
  JSON item;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  JSONParser *local_10;
  JSONParser *this_local;
  
  if (this->lex_state == ls_top) {
    return;
  }
  local_10 = this;
  if (this->parser_state == ps_done) {
    QTC::TC("libtests","JSON parse junk after object",0);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_90,this->offset);
    std::operator+(&local_70,"JSON: offset ",&local_90);
    std::operator+(&local_50,&local_70,": material follows end of object: ");
    std::operator+(&local_30,&local_50,&this->token);
    std::runtime_error::runtime_error(prVar4,(string *)&local_30);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((anonymous_namespace)::JSONParser::handleToken()::null_item == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::JSONParser::handleToken()::null_item),
     iVar2 != 0)) {
    JSON::makeNull();
    __cxa_atexit(JSON::~JSON,&handleToken::null_item,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::JSONParser::handleToken()::null_item);
  }
  JSON::JSON((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  bVar1 = std::
          vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ::empty(&this->stack);
  if (bVar1) {
    local_610 = &handleToken::null_item;
  }
  else {
    pvVar5 = std::
             vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ::back(&this->stack);
    local_610 = &pvVar5->item;
  }
  JSON::JSON((JSON *)local_c0,local_610);
  local_c4 = this->lex_state;
  this->lex_state = ls_top;
  switch(local_c4) {
  case ls_number:
    JSON::makeNumber(&local_298,&this->token);
    JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&local_298);
    JSON::~JSON(&local_298);
    break;
  default:
    local_3c1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_3c0,this->offset);
    std::operator+(&local_3a0,"JSON: offset ",&local_3c0);
    std::operator+(&local_380,&local_3a0,": premature end of input");
    std::runtime_error::runtime_error(prVar4,(string *)&local_380);
    local_3c1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_alpha:
    bVar1 = std::operator==(&this->token,"true");
    if (bVar1) {
      JSON::makeBool(&local_2a8,true);
      JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,&local_2a8);
      JSON::~JSON(&local_2a8);
    }
    else {
      bVar1 = std::operator==(&this->token,"false");
      if (bVar1) {
        JSON::makeBool(&local_2b8,false);
        JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&local_2b8);
        JSON::~JSON(&local_2b8);
      }
      else {
        bVar1 = std::operator==(&this->token,"null");
        if (!bVar1) {
          QTC::TC("libtests","JSON parse invalid keyword",0);
          local_349 = 1;
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_348,this->offset);
          std::operator+(&local_328,"JSON: offset ",&local_348);
          std::operator+(&local_308,&local_328,": invalid keyword ");
          std::operator+(&local_2e8,&local_308,&this->token);
          std::runtime_error::runtime_error(prVar4,(string *)&local_2e8);
          local_349 = 0;
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        JSON::makeNull();
        JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&local_2c8);
        JSON::~JSON(&local_2c8);
      }
    }
    break;
  case ls_after_string:
    if ((this->parser_state == ps_dict_begin) || (this->parser_state == ps_dict_after_comma)) {
      std::__cxx11::string::operator=((string *)&this->dict_key,(string *)&this->token);
      this->dict_key_offset = this->token_start;
      this->parser_state = ps_dict_after_key;
      local_150 = 1;
      goto LAB_0012d0b6;
    }
    JSON::makeString(&local_360,&this->token);
    JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&local_360);
    JSON::~JSON(&local_360);
    break;
  case ls_begin_array:
    JSON::makeArray();
    JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&local_e8);
    JSON::~JSON(&local_e8);
    break;
  case ls_end_array:
    if ((this->parser_state != ps_array_begin) && (this->parser_state != ps_array_after_item)) {
      QTC::TC("libtests","JSON parse unexpected ]",0);
      local_219 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_218,this->offset);
      std::operator+(&local_1f8,"JSON: offset ",&local_218);
      std::operator+(&local_1d8,&local_1f8,": unexpected array end delimiter");
      std::runtime_error::runtime_error(prVar4,(string *)&local_1d8);
      local_219 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar5 = std::
             vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ::back(&this->stack);
    this->parser_state = pvVar5->state;
    JSON::setEnd((JSON *)local_c0,this->offset);
    if (this->reactor != (Reactor *)0x0) {
      (*this->reactor->_vptr_Reactor[4])(this->reactor,local_c0);
    }
    if (this->parser_state != ps_done) {
      std::
      vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
      ::pop_back(&this->stack);
    }
    local_150 = 1;
    goto LAB_0012d0b6;
  case ls_begin_dict:
    JSON::makeDictionary();
    JSON::operator=((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&local_d8);
    JSON::~JSON(&local_d8);
    break;
  case ls_end_dict:
    if ((this->parser_state != ps_dict_begin) && (this->parser_state != ps_dict_after_item)) {
      QTC::TC("libtests","JSON parse unexpected }",0);
      local_281 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_280,this->offset);
      std::operator+(&local_260,"JSON: offset ",&local_280);
      std::operator+(&local_240,&local_260,": unexpected dictionary end delimiter");
      std::runtime_error::runtime_error(prVar4,(string *)&local_240);
      local_281 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar5 = std::
             vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ::back(&this->stack);
    this->parser_state = pvVar5->state;
    JSON::setEnd((JSON *)local_c0,this->offset);
    if (this->reactor != (Reactor *)0x0) {
      (*this->reactor->_vptr_Reactor[4])(this->reactor,local_c0);
    }
    if (this->parser_state != ps_done) {
      std::
      vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
      ::pop_back(&this->stack);
    }
    local_150 = 1;
    goto LAB_0012d0b6;
  case ls_colon:
    if (this->parser_state != ps_dict_after_key) {
      QTC::TC("libtests","JSON parse unexpected :",0);
      local_149 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_148,this->offset);
      std::operator+(&local_128,"JSON: offset ",&local_148);
      std::operator+(&local_108,&local_128,": unexpected colon");
      std::runtime_error::runtime_error(prVar4,(string *)&local_108);
      local_149 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->parser_state = ps_dict_after_colon;
    local_150 = 1;
    goto LAB_0012d0b6;
  case ls_comma:
    if ((this->parser_state != ps_dict_after_item) && (this->parser_state != ps_array_after_item)) {
      QTC::TC("libtests","JSON parse unexpected ,",0);
      local_1b1 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_1b0,this->offset);
      std::operator+(&local_190,"JSON: offset ",&local_1b0);
      std::operator+(&local_170,&local_190,": unexpected comma");
      std::runtime_error::runtime_error(prVar4,(string *)&local_170);
      local_1b1 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->parser_state == ps_dict_after_item) {
      this->parser_state = ps_dict_after_comma;
    }
    else {
      if (this->parser_state != ps_array_after_item) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar6,"JSONParser::handleToken: unexpected parser state for comma");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      this->parser_state = ps_array_after_comma;
    }
    local_150 = 1;
    goto LAB_0012d0b6;
  }
  this_00 = &tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  JSON::setStart((JSON *)this_00,this->token_start);
  JSON::setEnd((JSON *)this_00,this->offset);
  switch(this->parser_state) {
  case ps_top:
    bVar1 = JSON::isDictionary((JSON *)&tos.m.
                                        super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
    if ((!bVar1) &&
       (bVar1 = JSON::isArray((JSON *)&tos.m.
                                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount), !bVar1)) {
      local_454 = ps_done;
      std::
      vector<(anonymous_namespace)::JSONParser::StackFrame,std::allocator<(anonymous_namespace)::JSONParser::StackFrame>>
      ::emplace_back<(anonymous_namespace)::JSONParser::parser_state_e,JSON&>
                ((vector<(anonymous_namespace)::JSONParser::StackFrame,std::allocator<(anonymous_namespace)::JSONParser::StackFrame>>
                  *)&this->stack,&local_454,
                 (JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      this->parser_state = ps_done;
      local_150 = 1;
      goto LAB_0012d0b6;
    }
    this->parser_state = ps_done;
    break;
  case ps_dict_begin:
  case ps_dict_after_comma:
    QTC::TC("libtests","JSON parse string as dict key",0);
    local_429 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_428,this->offset);
    std::operator+(&local_408,"JSON: offset ",&local_428);
    std::operator+(&local_3e8,&local_408,": expect string as dictionary key");
    std::runtime_error::runtime_error(prVar4,(string *)&local_3e8);
    local_429 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ps_dict_after_key:
    QTC::TC("libtests","JSON parse expected colon",0);
    local_4b9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_4b8,this->offset);
    std::operator+(&local_498,"JSON: offset ",&local_4b8);
    std::operator+(&local_478,&local_498,": expected \':\'");
    std::runtime_error::runtime_error(prVar4,(string *)&local_478);
    local_4b9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ps_dict_after_colon:
    if ((this->reactor == (Reactor *)0x0) ||
       (uVar3 = (*this->reactor->_vptr_Reactor[6])
                          (this->reactor,&this->dict_key,
                           &tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount), (uVar3 & 1) == 0)) {
      JSON::addDictionaryMember(&local_440,(string *)local_c0,(JSON *)&this->dict_key);
      JSON::~JSON(&local_440);
    }
    this->parser_state = ps_dict_after_item;
    break;
  case ps_dict_after_item:
    QTC::TC("libtests","JSON parse expected , or }",0);
    local_521 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_520,this->offset);
    std::operator+(&local_500,"JSON: offset ",&local_520);
    std::operator+(&local_4e0,&local_500,": expected \',\' or \'}\'");
    std::runtime_error::runtime_error(prVar4,(string *)&local_4e0);
    local_521 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ps_array_begin:
  case ps_array_after_comma:
    if ((this->reactor == (Reactor *)0x0) ||
       (uVar3 = (*this->reactor->_vptr_Reactor[7])
                          (this->reactor,
                           &tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount), (uVar3 & 1) == 0)) {
      JSON::addArrayElement(&local_450,(JSON *)local_c0);
      JSON::~JSON(&local_450);
    }
    this->parser_state = ps_array_after_item;
    break;
  case ps_array_after_item:
    QTC::TC("libtests","JSON parse expected, or ]",0);
    local_589 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_588,this->offset);
    std::operator+(&local_568,"JSON: offset ",&local_588);
    std::operator+(&local_548,&local_568,": expected \',\' or \']\'");
    std::runtime_error::runtime_error(prVar4,(string *)&local_548);
    local_589 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ps_done:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"JSONParser::handleToken: unexpected parser state");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = JSON::isDictionary((JSON *)&tos.m.
                                      super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
  if ((bVar1) ||
     (bVar1 = JSON::isArray((JSON *)&tos.m.
                                     super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount), bVar1)) {
    std::
    vector<(anonymous_namespace)::JSONParser::StackFrame,std::allocator<(anonymous_namespace)::JSONParser::StackFrame>>
    ::emplace_back<(anonymous_namespace)::JSONParser::parser_state_e&,JSON&>
              ((vector<(anonymous_namespace)::JSONParser::StackFrame,std::allocator<(anonymous_namespace)::JSONParser::StackFrame>>
                *)&this->stack,&this->parser_state,
               (JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    bVar1 = JSON::isDictionary((JSON *)&tos.m.
                                        super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
    if (bVar1) {
      if (this->reactor != (Reactor *)0x0) {
        (*this->reactor->_vptr_Reactor[2])();
      }
      this->parser_state = ps_dict_begin;
    }
    else {
      bVar1 = JSON::isArray((JSON *)&tos.m.
                                     super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
      if (bVar1) {
        if (this->reactor != (Reactor *)0x0) {
          (*this->reactor->_vptr_Reactor[3])();
        }
        this->parser_state = ps_array_begin;
      }
    }
    sVar7 = std::
            vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ::size(&this->stack);
    if (500 < sVar7) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_5f0,this->offset);
      std::operator+(&local_5d0,"JSON: offset ",&local_5f0);
      std::operator+(&local_5b0,&local_5d0,": maximum object depth exceeded");
      std::runtime_error::runtime_error(prVar4,(string *)&local_5b0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_150 = 0;
LAB_0012d0b6:
  JSON::~JSON((JSON *)local_c0);
  JSON::~JSON((JSON *)&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  return;
}

Assistant:

void
JSONParser::handleToken()
{
    if (lex_state == ls_top) {
        return;
    }

    if (parser_state == ps_done) {
        QTC::TC("libtests", "JSON parse junk after object");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": material follows end of object: " + token);
    }

    const static JSON null_item = JSON::makeNull();
    JSON item;
    auto tos = stack.empty() ? null_item : stack.back().item;
    auto ls = lex_state;
    lex_state = ls_top;

    switch (ls) {
    case ls_begin_dict:
        item = JSON::makeDictionary();
        break;

    case ls_begin_array:
        item = JSON::makeArray();
        break;

    case ls_colon:
        if (parser_state != ps_dict_after_key) {
            QTC::TC("libtests", "JSON parse unexpected :");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": unexpected colon");
        }
        parser_state = ps_dict_after_colon;
        return;

    case ls_comma:
        if (!((parser_state == ps_dict_after_item) || (parser_state == ps_array_after_item))) {
            QTC::TC("libtests", "JSON parse unexpected ,");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": unexpected comma");
        }
        if (parser_state == ps_dict_after_item) {
            parser_state = ps_dict_after_comma;
        } else if (parser_state == ps_array_after_item) {
            parser_state = ps_array_after_comma;
        } else {
            throw std::logic_error("JSONParser::handleToken: unexpected parser state for comma");
        }
        return;

    case ls_end_array:
        if (!(parser_state == ps_array_begin || parser_state == ps_array_after_item)) {
            QTC::TC("libtests", "JSON parse unexpected ]");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": unexpected array end delimiter");
        }
        parser_state = stack.back().state;
        tos.setEnd(offset);
        if (reactor) {
            reactor->containerEnd(tos);
        }
        if (parser_state != ps_done) {
            stack.pop_back();
        }
        return;

    case ls_end_dict:
        if (!((parser_state == ps_dict_begin) || (parser_state == ps_dict_after_item))) {
            QTC::TC("libtests", "JSON parse unexpected }");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": unexpected dictionary end delimiter");
        }
        parser_state = stack.back().state;
        tos.setEnd(offset);
        if (reactor) {
            reactor->containerEnd(tos);
        }
        if (parser_state != ps_done) {
            stack.pop_back();
        }
        return;

    case ls_number:
        item = JSON::makeNumber(token);
        break;

    case ls_alpha:
        if (token == "true") {
            item = JSON::makeBool(true);
        } else if (token == "false") {
            item = JSON::makeBool(false);
        } else if (token == "null") {
            item = JSON::makeNull();
        } else {
            QTC::TC("libtests", "JSON parse invalid keyword");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": invalid keyword " + token);
        }
        break;

    case ls_after_string:
        if (parser_state == ps_dict_begin || parser_state == ps_dict_after_comma) {
            dict_key = token;
            dict_key_offset = token_start;
            parser_state = ps_dict_after_key;
            return;
        } else {
            item = JSON::makeString(token);
        }
        break;

    default:
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": premature end of input");
        break;
    }

    item.setStart(token_start);
    item.setEnd(offset);

    switch (parser_state) {
    case ps_dict_begin:
    case ps_dict_after_comma:
        QTC::TC("libtests", "JSON parse string as dict key");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": expect string as dictionary key");
        break;

    case ps_dict_after_colon:
        if (!reactor || !reactor->dictionaryItem(dict_key, item)) {
            tos.addDictionaryMember(dict_key, item);
        }
        parser_state = ps_dict_after_item;
        break;

    case ps_array_begin:
    case ps_array_after_comma:
        if (!reactor || !reactor->arrayItem(item)) {
            tos.addArrayElement(item);
        }
        parser_state = ps_array_after_item;
        break;

    case ps_top:
        if (!(item.isDictionary() || item.isArray())) {
            stack.emplace_back(ps_done, item);
            parser_state = ps_done;
            return;
        }
        parser_state = ps_done;
        break;

    case ps_dict_after_key:
        QTC::TC("libtests", "JSON parse expected colon");
        throw std::runtime_error("JSON: offset " + std::to_string(offset) + ": expected ':'");
        break;

    case ps_dict_after_item:
        QTC::TC("libtests", "JSON parse expected , or }");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": expected ',' or '}'");
        break;

    case ps_array_after_item:
        QTC::TC("libtests", "JSON parse expected, or ]");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": expected ',' or ']'");
        break;

    case ps_done:
        throw std::logic_error("JSONParser::handleToken: unexpected parser state");
    }

    if (item.isDictionary() || item.isArray()) {
        stack.emplace_back(parser_state, item);
        // Calling container start method is postponed until after adding the containers to their
        // parent containers, if any. This makes it much easier to keep track of the current nesting
        // level.
        if (item.isDictionary()) {
            if (reactor) {
                reactor->dictionaryStart();
            }
            parser_state = ps_dict_begin;
        } else if (item.isArray()) {
            if (reactor) {
                reactor->arrayStart();
            }
            parser_state = ps_array_begin;
        }

        if (stack.size() > 500) {
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) + ": maximum object depth exceeded");
        }
    }
}